

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

bool __thiscall vkb::PhysicalDevice::is_extension_present(PhysicalDevice *this,char *ext)

{
  pointer pbVar1;
  int iVar2;
  long lVar3;
  pointer pbVar4;
  long lVar5;
  pointer pbVar6;
  
  pbVar6 = (this->available_extensions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->available_extensions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pbVar1 - (long)pbVar6;
  if (0 < lVar5 >> 7) {
    lVar3 = (lVar5 >> 7) + 1;
    do {
      iVar2 = std::__cxx11::string::compare((char *)pbVar6);
      pbVar4 = pbVar6;
      if (iVar2 == 0) goto LAB_001336e6;
      iVar2 = std::__cxx11::string::compare((char *)(pbVar6 + 1));
      pbVar4 = pbVar6 + 1;
      if (iVar2 == 0) goto LAB_001336e6;
      iVar2 = std::__cxx11::string::compare((char *)(pbVar6 + 2));
      pbVar4 = pbVar6 + 2;
      if (iVar2 == 0) goto LAB_001336e6;
      iVar2 = std::__cxx11::string::compare((char *)(pbVar6 + 3));
      pbVar4 = pbVar6 + 3;
      if (iVar2 == 0) goto LAB_001336e6;
      pbVar6 = pbVar6 + 4;
      lVar3 = lVar3 + -1;
      lVar5 = lVar5 + -0x80;
    } while (1 < lVar3);
  }
  lVar5 = lVar5 >> 5;
  if (lVar5 != 1) {
    pbVar4 = pbVar6;
    if (lVar5 != 2) {
      pbVar4 = pbVar1;
      if ((lVar5 != 3) ||
         (iVar2 = std::__cxx11::string::compare((char *)pbVar6), pbVar4 = pbVar6, iVar2 == 0))
      goto LAB_001336e6;
      pbVar4 = pbVar6 + 1;
    }
    iVar2 = std::__cxx11::string::compare((char *)pbVar4);
    if (iVar2 == 0) goto LAB_001336e6;
    pbVar6 = pbVar4 + 1;
  }
  iVar2 = std::__cxx11::string::compare((char *)pbVar6);
  pbVar4 = pbVar1;
  if (iVar2 == 0) {
    pbVar4 = pbVar6;
  }
LAB_001336e6:
  return pbVar4 != (this->available_extensions).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool PhysicalDevice::is_extension_present(const char* ext) const {
    return std::find_if(std::begin(available_extensions), std::end(available_extensions), [ext](std::string const& ext_name) {
        return ext_name == ext;
    }) != std::end(available_extensions);
}